

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cc7b::RcExternMethodsInterfaceTest::RcExternMethodsInterfaceTest
          (RcExternMethodsInterfaceTest *this)

{
  int iVar1;
  CodecFactory *pCVar2;
  ParamType *pPVar3;
  
  pPVar3 = testing::WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>::
           GetParam();
  pCVar2 = (pPVar3->super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_int>).
           super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_00545840;
  (this->super_EncoderTest).codec_ = pCVar2;
  (this->super_EncoderTest).abort_ = false;
  (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_EncoderTest).stats_.buffer_.field_2;
  (this->super_EncoderTest).stats_.buffer_._M_string_length = 0;
  (this->super_EncoderTest).stats_.buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_EncoderTest).mode_ = kRealTime;
  (this->super_EncoderTest).init_flags_ = 0;
  (this->super_EncoderTest).frame_flags_ = 0;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  libaom_test::CodecTestWithParam<int>::CodecTestWithParam(&this->super_CodecTestWithParam<int>);
  (this->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_00546b98;
  (this->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.super_Test._vptr_Test =
       (_func_int **)&PTR__RcExternMethodsInterfaceTest_00546c40;
  (this->super_CodecTestWithParam<int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__RcExternMethodsInterfaceTest_00546c80;
  AomAV1RateControlRtcConfig::AomAV1RateControlRtcConfig(&this->rc_cfg_);
  pPVar3 = testing::WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>::
           GetParam();
  iVar1 = (pPVar3->super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_int>).
          super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  this->aq_mode_ = iVar1;
  (this->rc_cfg_).width = 0x280;
  (this->rc_cfg_).height = 0x1e0;
  (this->rc_cfg_).max_quantizer = 0x34;
  (this->rc_cfg_).min_quantizer = 2;
  (this->rc_cfg_).target_bandwidth = 1000;
  (this->rc_cfg_).buf_initial_sz = 600;
  (this->rc_cfg_).buf_optimal_sz = 600;
  (this->rc_cfg_).buf_sz = 1000;
  (this->rc_cfg_).undershoot_pct = 0x32;
  (this->rc_cfg_).overshoot_pct = 0x32;
  (this->rc_cfg_).max_intra_bitrate_pct = 1000;
  (this->rc_cfg_).framerate = 30.0;
  (this->rc_cfg_).ss_number_layers = 1;
  (this->rc_cfg_).ts_number_layers = 1;
  (this->rc_cfg_).scaling_factor_num[0] = 1;
  (this->rc_cfg_).scaling_factor_den[0] = 1;
  (this->rc_cfg_).layer_target_bitrate[0] = 1000;
  (this->rc_cfg_).max_quantizers[0] = 0x34;
  (this->rc_cfg_).min_quantizers[0] = 2;
  (this->rc_cfg_).aq_mode = iVar1;
  return;
}

Assistant:

RcExternMethodsInterfaceTest()
      : EncoderTest(GET_PARAM(0)), aq_mode_(GET_PARAM(1)) {
    SetConfig();
  }